

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcSubContractResource::~IfcSubContractResource
          (IfcSubContractResource *this)

{
  IfcConstructionResource *this_00;
  long *plVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  
  lVar2 = *(long *)(*(long *)&this->super_IfcConstructionResource + -0x18);
  this_00 = (IfcConstructionResource *)(&(this->super_IfcConstructionResource).field_0x0 + lVar2);
  plVar1 = (long *)((this->JobDescription).ptr.field_2._M_local_buf + lVar2);
  plVar1[-0x36] = 0x82bd30;
  plVar1[3] = 0x82be20;
  plVar1[-0x25] = 0x82bd58;
  plVar1[-0x23] = 0x82bd80;
  plVar1[-0x1c] = 0x82bda8;
  plVar1[-0x1a] = 0x82bdd0;
  plVar1[-7] = 0x82bdf8;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_00 + 1);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  IfcConstructionResource::~IfcConstructionResource(this_00,&PTR_construction_vtable_24__0082be38);
  return;
}

Assistant:

IfcSubContractResource() : Object("IfcSubContractResource") {}